

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.h
# Opt level: O1

void __thiscall Memory::Recycler::ScanMemory<false>(Recycler *this,void **obj,size_t byteCount)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  undefined8 *in_FS_OFFSET;
  
  if (byteCount == 0) {
    return;
  }
  if ((this->collectionState).value == CollectionStateParallelMark) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.inl"
                       ,0x1ef,"(this->collectionState != CollectionStateParallelMark)",
                       "this->collectionState != CollectionStateParallelMark");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  if (this->enableScanInteriorPointers == true) {
    MarkContext::ScanMemory<false,true,false>(&this->markContext,obj,byteCount);
    return;
  }
  MarkContext::ScanMemory<false,false,false>(&this->markContext,obj,byteCount);
  return;
}

Assistant:

void ScanMemory(void ** obj, size_t byteCount) { if (byteCount != 0) { ScanMemoryInline<doSpecialMark>(obj, byteCount); } }